

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall
tonk::SessionOutgoing::QueueControl(SessionOutgoing *this,uint8_t *data,size_t bytes)

{
  ErrorResult *in_RDI;
  size_t in_stack_000000e8;
  uint8_t *in_stack_000000f0;
  MessageType in_stack_000000f8;
  uint in_stack_000000fc;
  SessionOutgoing *in_stack_00000100;
  
  queueMessage(in_stack_00000100,in_stack_000000fc,in_stack_000000f8,in_stack_000000f0,
               in_stack_000000e8);
  return (Result)in_RDI;
}

Assistant:

Result SessionOutgoing::QueueControl(
    const uint8_t* data,
    size_t bytes)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Control messages are reliable in-order but get put in the queue with
    // Unordered data so that it can be reliable and bypass bandwidth limits.
    // As a side-effect these control messages are not compressed
    return queueMessage(Queue_Unmetered, protocol::MessageType_Control, data, bytes);
}